

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O1

void radio_draw_update(t_gobj *client,_glist *glist)

{
  int iVar1;
  undefined4 extraout_var;
  _glist *p_Var2;
  ulong uVar3;
  char tag [128];
  
  iVar1 = glist_isvisible(glist);
  if (iVar1 != 0) {
    p_Var2 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar1));
    sprintf(tag,"%lxBUT%d",client,(ulong)*(uint *)&client[0x4a].g_pd);
    pdgui_vmess((char *)0x0,"crs rk rk",p_Var2,"itemconfigure",tag,"-fill",
                (ulong)*(uint *)&client[0x45].g_pd,"-outline",(ulong)*(uint *)&client[0x45].g_pd);
    sprintf(tag,"%lxBUT%d",client,(ulong)*(uint *)&client[0x49].g_pd);
    uVar3 = (ulong)*(uint *)((long)&client[0x44].g_next + 4);
    pdgui_vmess((char *)0x0,"crs rk rk",p_Var2,"itemconfigure",tag,"-fill",uVar3,"-outline",uVar3);
    *(undefined4 *)&client[0x4a].g_pd = *(undefined4 *)&client[0x49].g_pd;
  }
  return;
}

Assistant:

static void radio_draw_update(t_gobj *client, t_glist *glist)
{
    t_radio *x = (t_radio *)client;
    if(glist_isvisible(glist))
    {
        t_canvas *canvas = glist_getcanvas(glist);
        char tag[128];

        sprintf(tag, "%lxBUT%d", x, x->x_drawn);
        pdgui_vmess(0, "crs rk rk", canvas, "itemconfigure", tag,
            "-fill", x->x_gui.x_bcol,
            "-outline", x->x_gui.x_bcol);

        sprintf(tag, "%lxBUT%d", x, x->x_on);
        pdgui_vmess(0, "crs rk rk", canvas, "itemconfigure", tag,
            "-fill", x->x_gui.x_fcol,
            "-outline", x->x_gui.x_fcol);

        x->x_drawn = x->x_on;
    }
}